

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# touzet_kr_loop_tree_index_impl.h
# Opt level: O3

double __thiscall
ted::TouzetKRLoopTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
ted_k(TouzetKRLoopTreeIndex<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
      *this,TreeIndexAll *t1,TreeIndexAll *t2,int k)

{
  int t1_size;
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint *puVar5;
  uint y;
  bool bVar6;
  int iVar7;
  int iVar8;
  double *pdVar9;
  uint *puVar10;
  uint x;
  uint y_00;
  double dVar11;
  double extraout_XMM0_Qa;
  uint local_84;
  uint *local_70;
  
  t1_size = (t1->super_Constants).tree_size_;
  iVar1 = (t2->super_Constants).tree_size_;
  TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>::
  init_matrices(&this->
                 super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                ,t1_size,k);
  (this->
  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>).
  super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>.
  subproblem_counter_ = 0;
  iVar7 = t1_size - iVar1;
  iVar8 = -iVar7;
  if (0 < iVar7) {
    iVar8 = iVar7;
  }
  if (k < iVar8) {
    dVar11 = INFINITY;
  }
  else {
    local_70 = (uint *)(t1->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>.
                       _M_impl.super__Vector_impl_data._M_start;
    puVar4 = (uint *)(t1->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
    if (local_70 != puVar4) {
      do {
        puVar10 = (uint *)(t2->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>.
                          _M_impl.super__Vector_impl_data._M_start;
        puVar5 = (uint *)(t2->super_ListKR).list_kr_.super__Vector_base<int,_std::allocator<int>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
        if (puVar10 != puVar5) {
          uVar2 = *local_70;
          do {
            if ((int)uVar2 < 0) {
              local_84 = 0xffffffff;
              y_00 = 0xffffffff;
            }
            else {
              uVar3 = *puVar10;
              y_00 = 0xffffffff;
              local_84 = 0xffffffff;
              y = uVar3;
              x = uVar2;
joined_r0x0010d040:
              do {
                if ((int)y_00 < (int)y) {
                  bVar6 = TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                          ::k_relevant(&this->
                                        super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                       ,t1,t2,x,y,k);
                  if (!bVar6) {
                    y = (t2->super_PostLToLCh).postl_to_lch_.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[y];
                    goto joined_r0x0010d040;
                  }
                  y_00 = y;
                  if (local_84 == 0xffffffff) {
                    local_84 = x;
                  }
                }
                x = (t1->super_PostLToLCh).postl_to_lch_.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[x];
                y = uVar3;
              } while (-1 < (int)x);
            }
            if (-1 < (int)(local_84 | y_00)) {
              iVar8 = TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                      ::e_budget(&this->
                                  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                 ,t1,t2,local_84,y_00,k);
              (*(this->
                super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                ).
                super_TEDAlgorithm<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                ._vptr_TEDAlgorithm[2])(this,t1,t2,(ulong)local_84,(ulong)y_00,(ulong)(uint)k,iVar8)
              ;
              pdVar9 = data_structures::Matrix<double>::at
                                 (&(this->
                                   super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                   ).td_.super_Matrix<double>,(ulong)local_84,
                                  ((ulong)y_00 - (ulong)local_84) +
                                  (this->
                                  super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                                  ).td_.band_width_);
              *pdVar9 = extraout_XMM0_Qa;
            }
            puVar10 = puVar10 + 1;
          } while (puVar10 != puVar5);
        }
        local_70 = local_70 + 1;
      } while (local_70 != puVar4);
    }
    pdVar9 = data_structures::Matrix<double>::read_at
                       (&(this->
                         super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                         ).td_.super_Matrix<double>,(long)t1_size - 1,
                        ((long)iVar1 - (long)t1_size) +
                        (this->
                        super_TEDAlgorithmTouzet<cost_model::UnitCostModelLD<label::StringLabel>,_node::TreeIndexAll>
                        ).td_.band_width_);
    dVar11 = *pdVar9;
  }
  return dVar11;
}

Assistant:

double TouzetKRLoopTreeIndex<CostModel, TreeIndex>::ted_k(const TreeIndex& t1,
    const TreeIndex& t2, const int k) {
  
  const int t1_size = t1.tree_size_;
  const int t2_size = t2.tree_size_;

  init_matrices(t1_size, k);

  // Reset subproblem counter.
  subproblem_counter_ = 0;

  // If the pair of root nodes is not in k-strip (input tree size difference is
  // greater than k), return infinity.
  if (std::abs(t1_size - t2_size) > k) {
    return std::numeric_limits<double>::infinity();
  }
  
  // NOTE: There is an alternative approach to the kr-loop solution.
  //       Given kr pair, find top_x as in the current loop. Find top_y by
  //       swapping x and y parameters.
  //       The two solutions differ in the number of steps for the worst and
  //       best case.
  //       TODO: Verify empirically.
  
  // Iterate over all keyroot node pairs.
  for (auto x : t1.list_kr_) {
    for (auto y : t2.list_kr_) {
      int top_x = -1;
      int top_y = -1;
      // Search for top relevant pair.
      int x_l = x;
      while (x_l >= 0) { // We have to go through all x. Once we find a top_y,
                         // the consecutive x have to be checked against only
                         // y_l > top_y.
        int y_l = y;
        while (y_l > top_y) { // Verify only those nodes on the left
                              // path from y that are above the
                              // already found relevant node.
          if (k_relevant(t1, t2, x_l, y_l, k)) { // The pair has to be in the band
                                         // (std::abs(x_l - y_l) <= k satisfied
                                         // by the stronger k-relevancy)
                                         // and it has to be relevant.
            if (top_x == -1) top_x = x_l; // The first top_x found is maximal.
            top_y = y_l; // y_l always > top_y; std::max(top_y, y_l) not needed.
            break; // Don't continue down the path in the right-hand tree.
          }
          y_l = t2.postl_to_lch_[y_l];
        }
        x_l = t1.postl_to_lch_[x_l];
      }
      if (top_x > -1 && top_y > -1) {
        int e_max = e_budget(t1, t2, top_x, top_y, k);
        // Get max e over node pairs on left paths.
        // TODO: Whether to do it or not has to be evaluated. I don't remember
        //       but I think it is kind of an optimization if e_max can be
        //       smaller than k.
        // if (compute_e_max) {
          // e_max = 0;
          // int x_i = top_x;
          // while (x_i > -1) {
          //   int y_i = top_y;
          //   while (y_i > -1) {
          //     e_max = std::max(e_max, e_budget(t1, t2, x_i, y_i, k));
          //     y_i = t2.postl_to_lch_[y_i];
          //   }
          //   x_i = t1.postl_to_lch_[x_i];
          // }
        // }
        td_.at(top_x, top_y) = tree_dist(t1, t2, top_x, top_y, k, e_max);
      }
    }
  }
  return td_.read_at(t1_size-1, t2_size-1);
}